

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

bool __thiscall
AddrManImpl::Add_(AddrManImpl *this,vector<CAddress,_std::allocator<CAddress>_> *vAddr,
                 CNetAddr *source,seconds time_penalty)

{
  bool bVar1;
  Logger *this_00;
  uint uVar2;
  pointer addr;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  unsigned_long local_68;
  uint local_5c;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  addr = (vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
         super__Vector_impl_data._M_start;
  uVar2 = 0;
  if (addr != (vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
    do {
      bVar1 = AddSingle(this,addr,source,time_penalty);
      local_5c = uVar2 + bVar1;
      addr = addr + 1;
      uVar2 = local_5c;
    } while (addr != (vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
    if (local_5c == 0) {
      uVar2 = 0;
    }
    else {
      this_00 = LogInstance();
      bVar1 = BCLog::Logger::WillLogCategoryLevel(this_00,ADDRMAN,Debug);
      uVar2 = 1;
      if (bVar1) {
        local_68 = ((long)(vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        CNetAddr::ToStringAddr_abi_cxx11_(&local_58,source);
        logging_function._M_str = "Add_";
        logging_function._M_len = 4;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
        ;
        source_file._M_len = 0x5b;
        LogPrintFormatInternal<int,unsigned_long,std::__cxx11::string,int,int>
                  (logging_function,source_file,0x2b0,ADDRMAN,Debug,
                   (ConstevalFormatString<5U>)0x814d1d,(int *)&local_5c,&local_68,&local_58,
                   &this->nTried,&this->nNew);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        uVar2 = (uint)(0 < (int)local_5c);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return SUB41(uVar2,0);
}

Assistant:

bool AddrManImpl::Add_(const std::vector<CAddress>& vAddr, const CNetAddr& source, std::chrono::seconds time_penalty)
{
    int added{0};
    for (std::vector<CAddress>::const_iterator it = vAddr.begin(); it != vAddr.end(); it++) {
        added += AddSingle(*it, source, time_penalty) ? 1 : 0;
    }
    if (added > 0) {
        LogDebug(BCLog::ADDRMAN, "Added %i addresses (of %i) from %s: %i tried, %i new\n", added, vAddr.size(), source.ToStringAddr(), nTried, nNew);
    }
    return added > 0;
}